

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* lest::split_arguments
            (pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,texts *args)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer pcVar1;
  text *ptVar2;
  int iVar3;
  undefined8 uVar4;
  runtime_error *this_01;
  undefined1 uVar5;
  pointer pbVar6;
  _Alloc_hider _Var7;
  undefined1 uVar8;
  bool bVar9;
  undefined1 uVar10;
  text opt;
  text val;
  text arg;
  texts in;
  seed_t local_25c;
  undefined1 local_258 [56];
  undefined8 local_220;
  int local_214;
  undefined8 local_210;
  undefined8 local_208;
  undefined8 local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  ulong local_1d8;
  undefined8 local_1d0;
  undefined1 *local_1c8;
  long local_1c0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [32];
  _Alloc_hider local_188;
  char local_178 [16];
  undefined8 local_168;
  undefined8 local_160;
  value_type local_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_120;
  text local_118;
  text local_f8;
  text local_d8;
  text local_b8;
  text local_98;
  runtime_error local_78 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar6 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar6 == (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    iVar3 = 1;
    local_208 = 0;
    uVar5 = 0;
    local_220 = 0;
    local_1d0 = 0;
    uVar8 = 0;
    local_210 = 0;
    uVar10 = 0;
    local_25c = 0;
    local_1f8 = 0;
    local_200 = 0;
    local_1f0 = 0;
    local_1e8 = 0;
    local_1e0 = 0;
  }
  else {
    local_214 = 1;
    bVar9 = true;
    local_1e0 = 0;
    local_1e8 = 0;
    local_1f0 = 0;
    local_200 = 0;
    local_1f8 = 0;
    local_25c = 0;
    local_160 = 0;
    local_210 = 0;
    local_168 = 0;
    local_1d0 = 0;
    local_220 = 0;
    local_1d8 = 0;
    local_208 = 0;
    local_120 = __return_storage_ptr__;
    do {
      local_258._0_8_ = local_258 + 0x10;
      local_258._8_8_ = 0;
      local_258._16_4_ = local_258._16_4_ & 0xffffff00;
      local_1c8 = local_1b8;
      local_1c0 = 0;
      local_1b8[0] = 0;
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      pcVar1 = (pbVar6->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_158,pcVar1,pcVar1 + pbVar6->_M_string_length);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,local_158._M_dataplus._M_p,
                 local_158._M_dataplus._M_p + local_158._M_string_length);
      split_option((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1a8,&local_98);
      std::__cxx11::string::_M_assign((string *)local_258);
      std::__cxx11::string::_M_assign((string *)&local_1c8);
      if (local_188._M_p != local_178) {
        operator_delete(local_188._M_p);
      }
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if (bVar9) {
        if (*(char *)local_258._0_8_ != '-') {
          bVar9 = false;
          goto LAB_001084e4;
        }
        iVar3 = std::__cxx11::string::compare(local_258);
        if (iVar3 == 0) {
          bVar9 = false;
          goto LAB_001084f9;
        }
        uVar4 = std::__cxx11::string::compare(local_258);
        if ((int)uVar4 == 0) {
LAB_00108554:
          local_1e0 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
        }
        else {
          uVar4 = std::__cxx11::string::compare(local_258);
          if ((int)uVar4 == 0) goto LAB_00108554;
          uVar4 = std::__cxx11::string::compare(local_258);
          if ((int)uVar4 == 0) {
LAB_00108565:
            local_1e8 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
          }
          else {
            uVar4 = std::__cxx11::string::compare(local_258);
            if ((int)uVar4 == 0) goto LAB_00108565;
            uVar4 = std::__cxx11::string::compare(local_258);
            if ((int)uVar4 == 0) {
LAB_00108571:
              local_1f0 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
            }
            else {
              uVar4 = std::__cxx11::string::compare(local_258);
              if ((int)uVar4 == 0) goto LAB_00108571;
              uVar4 = std::__cxx11::string::compare(local_258);
              if ((int)uVar4 == 0) {
LAB_0010857d:
                local_1f8 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
              }
              else {
                uVar4 = std::__cxx11::string::compare(local_258);
                if ((int)uVar4 == 0) goto LAB_0010857d;
                uVar4 = std::__cxx11::string::compare(local_258);
                if ((int)uVar4 == 0) {
LAB_00108589:
                  local_200 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                }
                else {
                  uVar4 = std::__cxx11::string::compare(local_258);
                  if ((int)uVar4 == 0) goto LAB_00108589;
                  uVar4 = std::__cxx11::string::compare(local_258);
                  if ((int)uVar4 == 0) {
LAB_00108595:
                    local_208 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                  }
                  else {
                    uVar4 = std::__cxx11::string::compare(local_258);
                    if ((int)uVar4 == 0) goto LAB_00108595;
                    uVar4 = std::__cxx11::string::compare(local_258);
                    if ((int)uVar4 == 0) {
LAB_001085a1:
                      local_1d8 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                    }
                    else {
                      uVar4 = std::__cxx11::string::compare(local_258);
                      if ((int)uVar4 == 0) goto LAB_001085a1;
                      uVar4 = std::__cxx11::string::compare(local_258);
                      if ((int)uVar4 == 0) {
LAB_001085b0:
                        local_220 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                      }
                      else {
                        uVar4 = std::__cxx11::string::compare(local_258);
                        if ((int)uVar4 == 0) goto LAB_001085b0;
                        uVar4 = std::__cxx11::string::compare(local_258);
                        if ((int)uVar4 == 0) {
LAB_001085bc:
                          local_210 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                        }
                        else {
                          uVar4 = std::__cxx11::string::compare(local_258);
                          if ((int)uVar4 == 0) goto LAB_001085bc;
                          uVar4 = std::__cxx11::string::compare(local_258);
                          if ((int)uVar4 == 0) {
                            local_160 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                          }
                          else {
                            iVar3 = std::__cxx11::string::compare(local_258);
                            if (iVar3 == 0) {
                              iVar3 = std::__cxx11::string::compare((char *)&local_1c8);
                              if (iVar3 == 0) goto LAB_001084f9;
                            }
                            iVar3 = std::__cxx11::string::compare(local_258);
                            if (iVar3 == 0) {
                              uVar4 = std::__cxx11::string::compare((char *)&local_1c8);
                              if ((int)uVar4 == 0) {
                                local_1d0 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                                goto LAB_001084f9;
                              }
                            }
                            iVar3 = std::__cxx11::string::compare(local_258);
                            if (iVar3 == 0) {
                              uVar4 = std::__cxx11::string::compare((char *)&local_1c8);
                              if ((int)uVar4 == 0) {
                                local_168 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                                goto LAB_001084f9;
                              }
                            }
                            iVar3 = std::__cxx11::string::compare(local_258);
                            if (iVar3 == 0) {
                              local_1a8._0_8_ = local_1a8 + 0x10;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_1a8,"--random-seed","");
                              local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
                              std::__cxx11::string::_M_construct<char*>
                                        ((string *)&local_b8,local_1a8._0_8_,
                                         (pointer)(local_1a8._0_8_ +
                                                  CONCAT44(local_1a8._12_4_,
                                                           CONCAT13(local_1a8[0xb],
                                                                    CONCAT12(local_1a8[10],
                                                                             CONCAT11(local_1a8[9],
                                                                                      local_1a8[8]))
                                                                   ))));
                              local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
                              std::__cxx11::string::_M_construct<char*>
                                        ((string *)&local_d8,local_1c8,local_1c8 + local_1c0);
                              local_25c = seed(&local_b8,&local_d8);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                                operator_delete(local_d8._M_dataplus._M_p);
                              }
                              ptVar2 = &local_b8;
                              _Var7._M_p = local_b8._M_dataplus._M_p;
                            }
                            else {
                              iVar3 = std::__cxx11::string::compare(local_258);
                              if (iVar3 != 0) {
                                this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                                std::operator+(&local_50,"unrecognised option \'",
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_258);
                                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_1a8,&local_50,"\' (try option --help)");
                                std::runtime_error::runtime_error(local_78,(string *)local_1a8);
                                std::runtime_error::runtime_error(this_01,local_78);
                                __cxa_throw(this_01,&std::runtime_error::typeinfo,
                                            std::runtime_error::~runtime_error);
                              }
                              local_1a8._0_8_ = local_1a8 + 0x10;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_1a8,"--repeat","");
                              local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
                              std::__cxx11::string::_M_construct<char*>
                                        ((string *)&local_f8,local_1a8._0_8_,
                                         (pointer)(local_1a8._0_8_ +
                                                  CONCAT44(local_1a8._12_4_,
                                                           CONCAT13(local_1a8[0xb],
                                                                    CONCAT12(local_1a8[10],
                                                                             CONCAT11(local_1a8[9],
                                                                                      local_1a8[8]))
                                                                   ))));
                              local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                              std::__cxx11::string::_M_construct<char*>
                                        ((string *)&local_118,local_1c8,local_1c8 + local_1c0);
                              local_214 = repeat(&local_f8,&local_118);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_118._M_dataplus._M_p != &local_118.field_2) {
                                operator_delete(local_118._M_dataplus._M_p);
                              }
                              ptVar2 = &local_f8;
                              _Var7._M_p = local_f8._M_dataplus._M_p;
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)_Var7._M_p != &ptVar2->field_2) {
                              operator_delete(_Var7._M_p);
                            }
                            if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                              operator_delete((void *)local_1a8._0_8_);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
LAB_001084e4:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_138,&local_158);
      }
LAB_001084f9:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p);
      }
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8);
      }
      if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
        operator_delete((void *)local_258._0_8_);
      }
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
    uVar5 = 1;
    if ((local_1d8 & 1) == 0) {
      uVar5 = (undefined1)local_220;
    }
    uVar10 = (undefined1)local_160;
    uVar8 = (undefined1)local_168;
    __return_storage_ptr__ = local_120;
    iVar3 = local_214;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_68,&local_138);
  this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_1a8 + 0x18);
  local_1a8._0_8_ =
       CONCAT17((char)local_220,
                CONCAT16(uVar5,CONCAT15((char)local_208,
                                        CONCAT14((char)local_1f8,
                                                 CONCAT13((char)local_200,
                                                          CONCAT12((char)local_1f0,
                                                                   CONCAT11((char)local_1e8,
                                                                            (char)local_1e0)))))));
  local_1a8[8] = (undefined1)local_1d0;
  local_1a8[10] = (undefined1)local_210;
  local_1a8._16_4_ = local_25c;
  local_1a8[9] = uVar8;
  local_1a8[0xb] = uVar10;
  local_1a8._12_4_ = iVar3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(this_00,&local_68);
  this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(local_258 + 0x18);
  local_258._16_4_ = local_1a8._16_4_;
  local_258._8_8_ =
       CONCAT44(local_1a8._12_4_,
                CONCAT13(local_1a8[0xb],CONCAT12(local_1a8[10],CONCAT11(local_1a8[9],local_1a8[8])))
               );
  local_258._0_8_ = local_1a8._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(this,this_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this_00);
  (__return_storage_ptr__->first).seed = local_258._16_4_;
  (__return_storage_ptr__->first).help = (bool)local_258[0];
  (__return_storage_ptr__->first).abort = (bool)local_258[1];
  (__return_storage_ptr__->first).count = (bool)local_258[2];
  (__return_storage_ptr__->first).list = (bool)local_258[3];
  (__return_storage_ptr__->first).tags = (bool)local_258[4];
  (__return_storage_ptr__->first).time = (bool)local_258[5];
  (__return_storage_ptr__->first).pass = (bool)local_258[6];
  (__return_storage_ptr__->first).zen = (bool)local_258[7];
  (__return_storage_ptr__->first).lexical = (bool)local_258[8];
  (__return_storage_ptr__->first).random = (bool)local_258[9];
  (__return_storage_ptr__->first).verbose = (bool)local_258[10];
  (__return_storage_ptr__->first).version = (bool)local_258[0xb];
  (__return_storage_ptr__->first).repeat = local_258._12_4_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&__return_storage_ptr__->second,this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<options, texts>
split_arguments( texts args )
{
    options option; texts in;

    bool in_options = true;

    for ( texts::iterator pos = args.begin(); pos != args.end() ; ++pos )
    {
        text opt, val, arg = *pos;
        tie( opt, val ) = split_option( arg );

        if ( in_options )
        {
            if      ( opt[0] != '-'                             ) { in_options     = false;           }
            else if ( opt == "--"                               ) { in_options     = false; continue; }
            else if ( opt == "-h"      || "--help"       == opt ) { option.help    =  true; continue; }
            else if ( opt == "-a"      || "--abort"      == opt ) { option.abort   =  true; continue; }
            else if ( opt == "-c"      || "--count"      == opt ) { option.count   =  true; continue; }
            else if ( opt == "-g"      || "--list-tags"  == opt ) { option.tags    =  true; continue; }
            else if ( opt == "-l"      || "--list-tests" == opt ) { option.list    =  true; continue; }
            else if ( opt == "-t"      || "--time"       == opt ) { option.time    =  true; continue; }
            else if ( opt == "-p"      || "--pass"       == opt ) { option.pass    =  true; continue; }
            else if ( opt == "-z"      || "--pass-zen"   == opt ) { option.zen     =  true; continue; }
            else if ( opt == "-v"      || "--verbose"    == opt ) { option.verbose =  true; continue; }
            else if (                     "--version"    == opt ) { option.version =  true; continue; }
            else if ( opt == "--order" && "declared"     == val ) { /* by definition */   ; continue; }
            else if ( opt == "--order" && "lexical"      == val ) { option.lexical =  true; continue; }
            else if ( opt == "--order" && "random"       == val ) { option.random  =  true; continue; }
            else if ( opt == "--random-seed" ) { option.seed   = seed  ( "--random-seed", val ); continue; }
            else if ( opt == "--repeat"      ) { option.repeat = repeat( "--repeat"     , val ); continue; }
            else throw std::runtime_error( "unrecognised option '" + opt + "' (try option --help)" );
        }
        in.push_back( arg );
    }
    option.pass = option.pass || option.zen;

    return std::make_pair( option, in );
}